

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_unit.c
# Opt level: O2

void setandextract_uint32(void)

{
  ulong length;
  uint k;
  uint16_t *list;
  uint64_t *words;
  ulong uVar1;
  uint32_t *out;
  int iVar2;
  uint offset;
  ulong uVar3;
  uint k_1;
  
  for (uVar3 = 1; uVar3 != 0x10000; uVar3 = uVar3 + 1) {
    iVar2 = 0;
    length = 0x10000 / (uVar3 & 0xffffffff);
    list = (uint16_t *)malloc((ulong)(uint)((int)length * 2));
    words = (uint64_t *)calloc(0x400,8);
    for (uVar1 = 0; uVar1 < length; uVar1 = uVar1 + 1) {
      list[uVar1] = (uint16_t)iVar2;
      iVar2 = iVar2 + (int)uVar3;
    }
    bitset_set_list(words,list,length);
    out = (uint32_t *)malloc(length * 4);
    bitset_extract_setbits(words,0x400,out,0);
    for (uVar1 = 0; uVar1 < length; uVar1 = uVar1 + 1) {
      _assert_int_equal((ulong)out[uVar1],(ulong)list[uVar1],
                        "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/util_unit.c"
                        ,0x44);
    }
    free(list);
    free(out);
    free(words);
  }
  return;
}

Assistant:

DEFINE_TEST(setandextract_uint32) {
    const unsigned int bitset_size = 1 << 16;
    const unsigned int bitset_size_in_words =
        bitset_size / (sizeof(uint64_t) * 8);

    for (unsigned int offset = 1; offset < bitset_size; offset++) {
        const unsigned int valsize = bitset_size / offset;
        uint16_t* vals = (uint16_t*)malloc(valsize * sizeof(uint16_t));
        uint64_t* bitset =
            (uint64_t*)calloc(bitset_size_in_words, sizeof(uint64_t));

        for (unsigned int k = 0; k < valsize; ++k) {
            vals[k] = (uint16_t)(k * offset);
        }

        bitset_set_list(bitset, vals, valsize);
        uint32_t* newvals = (uint32_t*)malloc(valsize * sizeof(uint32_t));
        bitset_extract_setbits(bitset, bitset_size_in_words, newvals, 0);

        for (unsigned int k = 0; k < valsize; ++k) {
            assert_int_equal(newvals[k], vals[k]);
        }

        free(vals);
        free(newvals);
        free(bitset);
    }
}